

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

int simplify_comp_quest(comp_quest_t *q,uint32 n_phone)

{
  uint uVar1;
  int local_1c;
  int prod_len;
  int ret;
  int i;
  uint32 n_phone_local;
  comp_quest_t *q_local;
  
  local_1c = 0;
  prod_len = 0;
  do {
    if (q->sum_len <= (uint)prod_len) {
      return local_1c;
    }
    uVar1 = simplify_conj(q->conj_q[prod_len],q->prod_len[prod_len],n_phone);
    if (uVar1 < q->prod_len[prod_len]) {
      if (q->prod_len[prod_len] < uVar1) {
        __assert_fail("!(prod_len > q->prod_len[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                      ,0x281,"int simplify_comp_quest(comp_quest_t *, uint32)");
      }
      q->prod_len[prod_len] = uVar1;
      local_1c = 1;
    }
    prod_len = prod_len + 1;
  } while( true );
}

Assistant:

int
simplify_comp_quest(comp_quest_t *q,
		    uint32 n_phone)
{
    int i;
    int ret = FALSE;
    int prod_len;

    for (i = 0; i < q->sum_len; i++) {
	prod_len = simplify_conj(q->conj_q[i], q->prod_len[i], n_phone);
	if (prod_len < q->prod_len[i]) {
	    assert(!(prod_len > q->prod_len[i]));
	    
	    q->prod_len[i] = prod_len;

	    ret = TRUE;
	}
    }

    /* TRUE if there is at least one term in the composite
     * question that was simplified */
    return ret;
}